

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          adjacency_list<boost::setS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
          *skel_graph)

{
  anon_class_16_2_2e3ffa89_for_val t;
  Dictionary_it DVar1;
  bool bVar2;
  type_conflict3 tVar3;
  size_t sVar4;
  vertices_size_type vVar5;
  edges_size_type eVar6;
  Dictionary *this_00;
  invalid_argument *this_01;
  pointer ppVar7;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *this_02;
  pointer ppVar8;
  Siblings *pSVar9;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  *r;
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  *r_00;
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  pVar10;
  undefined1 local_160 [40];
  undefined1 local_138 [8];
  Dictionary_it sh;
  unsigned_long v;
  unsigned_long u;
  reference edge;
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  boost_edges;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  local_f0;
  undefined1 local_e8 [16];
  Dictionary_it it;
  type local_a8;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *local_88;
  undefined8 local_80;
  anon_class_16_2_2e3ffa89_for_val local_78;
  pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>
  local_68;
  undefined1 local_58 [8];
  transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
  verts;
  adjacency_list<boost::setS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
  *skel_graph_local;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_local;
  
  verts.
  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
  .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_ = skel_graph;
  sVar4 = num_simplices(this);
  if (sVar4 != 0) {
    __assert_fail("num_simplices() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h"
                  ,0x5d5,
                  "void Gudhi::Simplex_tree<>::insert_graph(const OneSkeletonGraph &) [SimplexTreeOptions = Gudhi::Simplex_tree_options_default, OneSkeletonGraph = boost::adjacency_list<boost::setS, boost::vecS, boost::undirectedS, boost::property<Gudhi::vertex_filtration_t, double>, boost::property<Gudhi::edge_filtration_t, double>>]"
                 );
  }
  vVar5 = boost::
          num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
                    ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                      *)verts.
                        super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                        .
                        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                        .
                        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                        .
                        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                        .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
  if (vVar5 != 0) {
    eVar6 = boost::
            num_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config>
                      ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>
                        *)verts.
                          super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                          .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
    if (eVar6 == 0) {
      this->dimension_ = 0;
    }
    else {
      this->dimension_ = 1;
    }
    this_00 = &(this->root_).members_;
    vVar5 = boost::
            num_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
                      ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                        *)verts.
                          super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                          .
                          super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                          .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
    boost::container::
    flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
    ::reserve(this_00,vVar5);
    local_68 = boost::
               vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config>>
                         ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>_>
                           *)verts.
                             super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                             .
                             super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                             .
                             super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                             .
                             super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                             .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
    local_80 = verts.
               super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
               .
               super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_;
    t.skel_graph = (adjacency_list<boost::setS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                    *)verts.
                      super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                      .
                      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                      .
                      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                      .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_;
    t.this = this;
    local_88 = this;
    local_78 = (anon_class_16_2_2e3ffa89_for_val)
               boost::range_detail::forwarder<boost::range_detail::transform_holder>::operator()
                         ((forwarder<boost::range_detail::transform_holder> *)
                          &boost::adaptors::(anonymous_namespace)::transformed,t);
    boost::range_detail::operator|
              ((transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
                *)local_58,&local_68,
               (transform_holder<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70)>
                *)&local_78);
    boost::range_adl_barrier::
    begin<boost::range_detail::transformed_range<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>(boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>const&)::_lambda(auto:1)_1_,std::pair<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>const>>
              (&local_a8,(range_adl_barrier *)local_58,r);
    boost::range_adl_barrier::
    end<boost::range_detail::transformed_range<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>(boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>const&)::_lambda(auto:1)_1_,std::pair<boost::range_detail::integer_iterator<unsigned_long>,boost::range_detail::integer_iterator<unsigned_long>>const>>
              ((type *)&it,(range_adl_barrier *)local_58,r_00);
    boost::container::
    flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>
    ::
    insert<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::insert_graph<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>>(boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>const&)::_lambda(auto:1)_1_,std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,boost::range_detail::integer_iterator<unsigned_long>,boost::use_default,boost::use_default>>
              ((flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>
                *)this_00,&local_a8,
               (transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
                *)&it);
    boost::iterators::
    transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
    ::~transform_iterator
              ((transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
                *)&it);
    boost::iterators::
    transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>
    ::~transform_iterator(&local_a8);
    boost::range_adl_barrier::
    begin<boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>
              ((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
                *)(local_e8 + 8));
    while( true ) {
      boost::range_adl_barrier::
      end<boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>
                ((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
                  *)local_e8);
      bVar2 = boost::container::operator!=
                        ((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                          *)(local_e8 + 8),
                         (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                          *)local_e8);
      if (!bVar2) break;
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::vec_iterator(&local_f0,(nonconst_iterator *)(local_e8 + 8));
      update_simplex_tree_after_node_insertion(this,&local_f0);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
      ::operator++((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                    *)&boost_edges.second,(int)local_e8 + 8);
    }
    pVar10 = boost::
             edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config>
                       ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>::config>
                         *)verts.
                           super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                           .
                           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                           .
                           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                           .
                           super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                           .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
    while( true ) {
      boost_edges.first =
           pVar10.second.
           super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
           .m_iterator._M_node;
      edge.m_eproperty =
           (property_type *)
           pVar10.first.
           super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
           .m_iterator._M_node;
      tVar3 = boost::iterators::operator!=
                        ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                          *)&edge.m_eproperty,
                         (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                          *)&boost_edges);
      if (!tVar3) break;
      boost::iterators::detail::
      iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
      ::operator*((reference *)&u,
                  (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                   *)&edge.m_eproperty);
      v = boost::
          source<boost::undirected_tag,unsigned_long,boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>
                    ((edge_base<boost::undirected_tag,_unsigned_long> *)&u,
                     (adjacency_list<boost::setS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                      *)verts.
                        super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                        .
                        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                        .
                        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                        .
                        super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                        .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
      sh.m_ptr = (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                  *)boost::
                    target<boost::undirected_tag,unsigned_long,boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>
                              ((edge_base<boost::undirected_tag,_unsigned_long> *)&u,
                               (adjacency_list<boost::setS,_boost::vecS,_boost::directedS,_boost::property<Gudhi::vertex_filtration_t,_double,_boost::no_property>,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>,_boost::no_property,_boost::listS>
                                *)verts.
                                  super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                                  .
                                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                                  .
                                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                                  .
                                  super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                                  .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_);
      if ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
           *)v == sh.m_ptr) {
        this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_01,"Self-loops are not simplicial");
        __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if (sh.m_ptr < v) {
        std::swap<unsigned_long>(&v,(unsigned_long *)&sh);
      }
      find_vertex((Simplex_tree<Gudhi::Simplex_tree_options_default> *)(local_160 + 0x20),
                  (Vertex_handle)this);
      _to_node_it((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_138,
                  (Simplex_handle *)this);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
      ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                      *)(local_160 + 0x18),
                     (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                      *)local_138);
      bVar2 = has_children<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,false>>
                        (this,(vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                               *)(local_160 + 0x18));
      if (!bVar2) {
        ppVar7 = boost::container::
                 vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                 ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                               *)local_138);
        this_02 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                   *)operator_new(0x28);
        ppVar8 = boost::container::
                 vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                 ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                               *)local_138);
        Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        ::Simplex_tree_siblings(this_02,&this->root_,ppVar8->first);
        Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
        ::assign_children(&ppVar7->second,this_02);
      }
      ppVar7 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
               ::operator->((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
                             *)local_138);
      pSVar9 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
               ::children(&ppVar7->second);
      DVar1 = sh;
      boost::
      get<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>,boost::vecS,boost::setS,boost::undirectedS,boost::property<Gudhi::vertex_filtration_t,double,boost::no_property>,boost::property<Gudhi::edge_filtration_t,double,boost::no_property>,boost::no_property,boost::listS>::config>,Gudhi::edge_filtration_t,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
                (verts.
                 super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>_>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>,_boost::range_detail::integer_iterator<unsigned_long>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.m_f.m_impl.super_type.m_storage.dummy_._8_8_,&u);
      insert_node_<false,false,false,double_const&>
                ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_160,(Siblings *)this,
                 (Vertex_handle)pSVar9,(double *)((ulong)DVar1.m_ptr & 0xffffffff));
      boost::iterators::operator++
                ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                  *)&edge.m_eproperty,0);
      pVar10.second =
           (undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
            )(undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
              )boost_edges.first.
               super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
               .m_iterator._M_node;
      pVar10.first.
      super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
      .m_iterator._M_node =
           (iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
            )(iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::property<Gudhi::edge_filtration_t,_double,_boost::no_property>_>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
              )edge.m_eproperty;
    }
    boost::range_detail::
    transformed_range<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/include/gudhi/Simplex_tree.h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
    ::~transformed_range
              ((transformed_range<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Simplex_tree_include_gudhi_Simplex_tree_h:1509:70),_const_std::pair<boost::range_detail::integer_iterator<unsigned_long>,_boost::range_detail::integer_iterator<unsigned_long>_>_>
                *)local_58);
  }
  return;
}

Assistant:

void insert_graph(const OneSkeletonGraph& skel_graph) {
    // the simplex tree must be empty
    assert(num_simplices() == 0);

    // is there a better way to let the compiler know that we don't mean Simplex_tree::num_vertices?
    using boost::num_vertices;

    if (num_vertices(skel_graph) == 0) {
      return;
    }
    if (num_edges(skel_graph) == 0) {
      dimension_ = 0;
    } else {
      dimension_ = 1;
    }

    if constexpr (!Options::stable_simplex_handles)
      root_.members_.reserve(num_vertices(skel_graph)); // probably useless in most cases
    auto verts = vertices(skel_graph) | boost::adaptors::transformed([&](auto v){
        return Dit_value_t(v, Node(&root_, get(vertex_filtration_t(), skel_graph, v))); });
    root_.members_.insert(boost::begin(verts), boost::end(verts));
    // This automatically sorts the vertices, the graph concept doesn't guarantee the order in which we iterate.

    for (Dictionary_it it = boost::begin(root_.members_); it != boost::end(root_.members_); it++) {
      update_simplex_tree_after_node_insertion(it);
    }

    std::pair<typename boost::graph_traits<OneSkeletonGraph>::edge_iterator,
              typename boost::graph_traits<OneSkeletonGraph>::edge_iterator> boost_edges = edges(skel_graph);
    // boost_edges.first is the equivalent to boost_edges.begin()
    // boost_edges.second is the equivalent to boost_edges.end()
    for (; boost_edges.first != boost_edges.second; boost_edges.first++) {
      auto edge = *(boost_edges.first);
      auto u = source(edge, skel_graph);
      auto v = target(edge, skel_graph);
      if (u == v) throw std::invalid_argument("Self-loops are not simplicial");
      // We cannot skip edges with the wrong orientation and expect them to
      // come a second time with the right orientation, that does not always
      // happen in practice. emplace() should be a NOP when an element with the
      // same key is already there, so seeing the same edge multiple times is
      // ok.
      // Should we actually forbid multiple edges? That would be consistent
      // with rejecting self-loops.
      if (v < u) std::swap(u, v);
      auto sh = _to_node_it(find_vertex(u));
      if (!has_children(sh)) {
        sh->second.assign_children(new Siblings(&root_, sh->first));
      }

      insert_node_<false, false, false>(sh->second.children(), v, get(edge_filtration_t(), skel_graph, edge));
    }
  }